

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_FMPrepare(ym3438_t *chip)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ushort uVar6;
  Bit16u BVar7;
  ushort uVar8;
  ulong uVar9;
  
  uVar1 = chip->channel;
  uVar8 = 0;
  uVar2 = (ulong)(chip->cycles + 6) % 0x18;
  uVar9 = (ulong)chip->connect[uVar1];
  uVar3 = (ulong)(chip->cycles + 0x12) % 0x18;
  uVar4 = (ulong)(byte)((ushort)uVar2 / 6);
  lVar5 = uVar4 * 0xc0;
  if (fm_algorithm[uVar4][0][uVar9] != 0) {
    uVar8 = chip->fm_op1[uVar1][0];
  }
  if (*(int *)(lVar5 + 0x1dd7f0 + uVar9 * 4) == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = chip->fm_op1[uVar1][1];
  }
  if (*(int *)(lVar5 + 0x1dd810 + uVar9 * 4) != 0) {
    uVar6 = uVar6 | chip->fm_op2[uVar1];
  }
  if (*(int *)(lVar5 + 0x1dd830 + uVar9 * 4) != 0) {
    uVar8 = uVar8 | chip->fm_out[uVar3];
  }
  if (*(int *)(lVar5 + 0x1dd850 + uVar9 * 4) != 0) {
    uVar6 = uVar6 | chip->fm_out[uVar3];
  }
  if ((uint)uVar2 < 6) {
    BVar7 = 0;
    if (chip->fb[uVar1] != '\0') {
      BVar7 = (Bit16u)((int)(short)(uVar6 + uVar8) >> (10 - chip->fb[uVar1] & 0x1f));
    }
  }
  else {
    BVar7 = (Bit16u)((uint)(int)(short)(uVar6 + uVar8) >> 1);
  }
  chip->fm_mod[uVar2] = BVar7;
  if ((uint)uVar3 < 6) {
    chip->fm_op1[uVar1][1] = chip->fm_op1[uVar1][0];
    chip->fm_op1[uVar1][0] = chip->fm_out[uVar3];
  }
  else if ((uint)uVar3 - 0xc < 6) {
    chip->fm_op2[uVar1] = chip->fm_out[uVar3];
  }
  return;
}

Assistant:

void OPN2_FMPrepare(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 6) % 24;
    Bit32u channel = chip->channel;
    Bit16s mod, mod1, mod2;
    Bit32u op = slot / 6;
    Bit8u connect = chip->connect[channel];
    Bit32u prevslot = (chip->cycles + 18) % 24;

    /* Calculate modulation */
    mod1 = mod2 = 0;

    if (fm_algorithm[op][0][connect])
    {
        mod2 |= chip->fm_op1[channel][0];
    }
    if (fm_algorithm[op][1][connect])
    {
        mod1 |= chip->fm_op1[channel][1];
    }
    if (fm_algorithm[op][2][connect])
    {
        mod1 |= chip->fm_op2[channel];
    }
    if (fm_algorithm[op][3][connect])
    {
        mod2 |= chip->fm_out[prevslot];
    }
    if (fm_algorithm[op][4][connect])
    {
        mod1 |= chip->fm_out[prevslot];
    }
    mod = mod1 + mod2;
    if (op == 0)
    {
        /* Feedback */
        mod = mod >> (10 - chip->fb[channel]);
        if (!chip->fb[channel])
        {
            mod = 0;
        }
    }
    else
    {
        mod >>= 1;
    }
    chip->fm_mod[slot] = mod;

    slot = (chip->cycles + 18) % 24;
    /* OP1 */
    if (slot / 6 == 0)
    {
        chip->fm_op1[channel][1] = chip->fm_op1[channel][0];
        chip->fm_op1[channel][0] = chip->fm_out[slot];
    }
    /* OP2 */
    if (slot / 6 == 2)
    {
        chip->fm_op2[channel] = chip->fm_out[slot];
    }
}